

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64.hpp
# Opt level: O0

result_type trng::lcg64::f(result_type s,result_type a)

{
  uint uVar1;
  result_type rVar2;
  result_type in_RSI;
  result_type in_RDI;
  uint l;
  result_type p;
  result_type y;
  uint e;
  undefined4 local_34;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_8;
  
  if (in_RDI == 0) {
    local_8 = 0;
  }
  else {
    uVar1 = log2_floor(in_RDI);
    local_28 = 0;
    local_30 = in_RSI;
    for (local_34 = 0; local_34 <= uVar1; local_34 = local_34 + 1) {
      if ((1L << ((byte)local_34 & 0x3f) & in_RDI) != 0) {
        rVar2 = g(local_34,in_RSI);
        local_28 = rVar2 + local_30 * local_28;
      }
      local_30 = local_30 * local_30;
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64::result_type lcg64::f(lcg64::result_type s, lcg64::result_type a) {
    if (s == 0)
      return 0;
    const unsigned int e{log2_floor(s)};
    lcg64::result_type y{0}, p{a};
    for (unsigned int l{0}; l <= e; ++l) {
      if (((1ull << l) & s) > 0) {
        y = g(l, a) + p * y;
      }
      p *= p;
    }
    return y;
  }